

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.c
# Opt level: O3

int async(thread_pool_t *pool,future_t *future,callable_t callable)

{
  runnable_t runnable;
  int iVar1;
  int iVar2;
  callable_t *pcVar3;
  
  iVar2 = -3;
  if (future != (future_t *)0x0 && pool != (thread_pool_t *)0x0) {
    pcVar3 = (callable_t *)malloc(0x18);
    future->callable = pcVar3;
    if (pcVar3 == (callable_t *)0x0) {
      iVar2 = -2;
    }
    else {
      pcVar3->function = callable.function;
      pcVar3->arg = callable.arg;
      pcVar3->argsz = callable.argsz;
      iVar1 = sem_init((sem_t *)&future->mutex,0,0);
      iVar2 = -4;
      if (iVar1 == 0) {
        future->status = true;
        runnable.arg = future;
        runnable.function = fun;
        runnable.argsz = 0x40;
        iVar2 = defer(pool,runnable);
        if (iVar2 == 0) {
          return 0;
        }
      }
      free(future->callable);
    }
  }
  return iVar2;
}

Assistant:

int async(thread_pool_t *pool, future_t *future, callable_t callable) {
    if (!pool || !future) {
        return invalid_argument_error;
    }

    if (!(future->callable = malloc(sizeof(callable_t)))) {
        return memory_error;
    }

    future->callable->function = callable.function;
    future->callable->arg = callable.arg;
    future->callable->argsz = callable.argsz;

    if (sem_init(&(future->mutex), THREAD_SEMAPHORE, 0)) {
        free(future->callable);
        return semaphore_error;
    }

    future->status = pending;

    int err;

    if ((err = defer(pool, (runnable_t) {
            .function = fun,
            .arg = future,
            .argsz = sizeof(future_t)}))) {
        free(future->callable);
        return err;
    }

    return success;
}